

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinSerializer<std::unique_ptr<int,_std::default_delete<int>_>,_void>::
     serialize<OutputStream>(unique_ptr<int,_std::default_delete<int>_> *opt,OutputStream *ostream)

{
  if ((opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl != (int *)0x0) {
    TrivialSerializer<unsigned_char>::serialize<OutputStream>('\x01',ostream);
    serialize<int,OutputStream>
              ((opt->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl,ostream);
    return;
  }
  TrivialSerializer<unsigned_char>::serialize<OutputStream>('\0',ostream);
  return;
}

Assistant:

static void serialize(const Optional& opt, OutputStream& ostream)
  {
    if (opt)
    {
      mserialize::serialize(std::uint8_t{1}, ostream);
      mserialize::serialize(*opt, ostream);
    }
    else
    {
      mserialize::serialize(std::uint8_t{0}, ostream);
    }
  }